

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::FboColorTests::init(FboColorTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  TextureChannelClass TVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  FboTestCase *pFVar5;
  char *pcVar6;
  TextureFormat TVar7;
  TestNode *pTVar8;
  TestNode *node;
  long lVar9;
  string fmtName;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"clear",
             "Color clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d0fd90;
    *(undefined8 *)
     ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x7500000081;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "Texture 2D tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0xa8);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d0fe10;
    *(deUint32 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
         = dVar1;
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = dVar1;
    *(undefined8 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
         0x7500000081;
    *(undefined8 *)
     ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         0x8000000063;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texcube",
             "Texture cube map tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d0fe78;
    *(undefined8 *)
     ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x8000000080;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2darray",
             "Texture 2D array tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d0fee0;
    *(undefined8 *)
     ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x8000000080;
    *(undefined4 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 5
    ;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex3d",
             "Texture 3D tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d0ff48;
    *(undefined8 *)
     ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x8000000080;
    *(undefined4 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 5
    ;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blend",
             "Blending tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  do {
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    TVar7 = glu::mapGLInternalFormat(dVar1);
    TVar3 = tcu::getTextureChannelClass(TVar7.type);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,pcVar6,(allocator<char> *)local_70);
    if ((TVar7.type != FLOAT) &&
       ((TVar3 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) != TEXTURECHANNELCLASS_SIGNED_INTEGER))
    {
      pFVar5 = (FboTestCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_50,local_48 + (long)local_50);
      std::__cxx11::string::append((char *)local_70);
      FboTestCase::FboTestCase(pFVar5,pCVar2,(char *)local_70[0],"",false);
      *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_00d0ffb0;
      *(undefined8 *)
       ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x6f0000007f;
      *(undefined8 *)((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           0x800600008006;
      *(undefined8 *)
       ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           0x30300000302;
      *(undefined8 *)
       ((long)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length + 4) =
           0x100000000;
      tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "repeated_clear","Repeated clears and blits");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sample",
             "Read by sampling");
  tcu::TestNode::addChild(pTVar4,pTVar8);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "2D Texture");
  tcu::TestNode::addChild(pTVar8,node);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d10018;
    tcu::TestNode::addChild(node,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blit",
             "Blitted");
  tcu::TestNode::addChild(pTVar4,pTVar8);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "2D Texture");
  tcu::TestNode::addChild(pTVar8,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d10080;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rbo",
             "Renderbuffer");
  tcu::TestNode::addChild(pTVar8,pTVar4);
  lVar9 = 0;
  do {
    pFVar5 = (FboTestCase *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::colorFormats + lVar9);
    pcVar6 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar5,pCVar2,pcVar6,"",false);
    *(deUint32 *)&pFVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    (pFVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_00d100e8;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar5);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x90);
  return extraout_EAX;
}

Assistant:

void FboColorTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F,

		// GL_EXT_color_buffer_half_float
		GL_RGB16F
	};

	// .clear
	{
		tcu::TestCaseGroup* clearGroup = new tcu::TestCaseGroup(m_testCtx, "clear", "Color clears");
		addChild(clearGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
			clearGroup->addChild(new FboColorClearCase(m_context, getFormatName(colorFormats[ndx]), "", colorFormats[ndx], 129, 117));
	}

	// .tex2d
	{
		tcu::TestCaseGroup* tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "Texture 2D tests");
		addChild(tex2DGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex2DGroup->addChild(new FboColorMultiTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
															colorFormats[fmtNdx], IVec2(129, 117),
															colorFormats[fmtNdx], IVec2(99, 128)));
	}

	// .texcube
	{
		tcu::TestCaseGroup* texCubeGroup = new tcu::TestCaseGroup(m_testCtx, "texcube", "Texture cube map tests");
		addChild(texCubeGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			texCubeGroup->addChild(new FboColorTexCubeCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
														   colorFormats[fmtNdx], IVec2(128, 128)));
	}

	// .tex2darray
	{
		tcu::TestCaseGroup* tex2DArrayGroup = new tcu::TestCaseGroup(m_testCtx, "tex2darray", "Texture 2D array tests");
		addChild(tex2DArrayGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex2DArrayGroup->addChild(new FboColorTex2DArrayCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
																 colorFormats[fmtNdx], IVec3(128, 128, 5)));
	}

	// .tex3d
	{
		tcu::TestCaseGroup* tex3DGroup = new tcu::TestCaseGroup(m_testCtx, "tex3d", "Texture 3D tests");
		addChild(tex3DGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex3DGroup->addChild(new FboColorTex3DCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
													   colorFormats[fmtNdx], IVec3(128, 128, 5)));
	}

	// .blend
	{
		tcu::TestCaseGroup* blendGroup = new tcu::TestCaseGroup(m_testCtx, "blend", "Blending tests");
		addChild(blendGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			deUint32					format		= colorFormats[fmtNdx];
			tcu::TextureFormat			texFmt		= glu::mapGLInternalFormat(format);
			tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			string						fmtName		= getFormatName(format);

			if (texFmt.type	== tcu::TextureFormat::FLOAT				||
				fmtClass	== tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER	||
				fmtClass	== tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
				continue; // Blending is not supported.

			blendGroup->addChild(new FboBlendCase(m_context, (fmtName + "_src_over").c_str(), "", format, IVec2(127, 111), GL_FUNC_ADD, GL_FUNC_ADD, GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE));
		}
	}

	// .repeated_clear
	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated clears and blits");
		addChild(repeatedClearGroup);

		// .sample.tex2d
		{
			tcu::TestCaseGroup* const sampleGroup = new tcu::TestCaseGroup(m_testCtx, "sample", "Read by sampling");
			repeatedClearGroup->addChild(sampleGroup);

			tcu::TestCaseGroup* const tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "2D Texture");
			sampleGroup->addChild(tex2DGroup);

			for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
				tex2DGroup->addChild(new FboRepeatedClearSampleTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]),
																		 "", colorFormats[fmtNdx]));
		}

		// .blit
		{
			tcu::TestCaseGroup* const blitGroup = new tcu::TestCaseGroup(m_testCtx, "blit", "Blitted");
			repeatedClearGroup->addChild(blitGroup);

			// .tex2d
			{
				tcu::TestCaseGroup* const tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "2D Texture");
				blitGroup->addChild(tex2DGroup);

				for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
					tex2DGroup->addChild(new FboRepeatedClearBlitTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]),
																		   "", colorFormats[fmtNdx]));
			}

			// .rbo
			{
				tcu::TestCaseGroup* const rboGroup = new tcu::TestCaseGroup(m_testCtx, "rbo", "Renderbuffer");
				blitGroup->addChild(rboGroup);

				for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
					rboGroup->addChild(new FboRepeatedClearBlitRboCase(m_context, getFormatName(colorFormats[fmtNdx]),
																	   "", colorFormats[fmtNdx]));
			}
		}
	}
}